

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes
          (ArrayFeatureType_EnumeratedShapes *this,ArrayFeatureType_EnumeratedShapes *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ArrayFeatureType_EnumeratedShapes_00426808;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shapes_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->shapes_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->shapes_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->shapes_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
            (&(this->shapes_).super_RepeatedPtrFieldBase,&(from->shapes_).super_RepeatedPtrFieldBase
            );
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

ArrayFeatureType_EnumeratedShapes::ArrayFeatureType_EnumeratedShapes(const ArrayFeatureType_EnumeratedShapes& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shapes_(from.shapes_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ArrayFeatureType.EnumeratedShapes)
}